

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

CURLcode ws_flush(Curl_easy *data,websocket *ws,_Bool blocking)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  size_t *in_RCX;
  bufq *q;
  size_t n;
  size_t outlen;
  uchar *out;
  
  q = &ws->sendbuf;
  _Var2 = Curl_bufq_is_empty(q);
  if (!_Var2) {
    while (_Var2 = Curl_bufq_peek(q,&out,&outlen), _Var2) {
      if (blocking) {
        CVar3 = ws_send_raw_blocking(data,(websocket *)out,(char *)outlen,(size_t)in_RCX);
        n = outlen;
        if (CVar3 != CURLE_OK) {
          n = 0;
        }
      }
      else if (((data->set).connect_only != '\0') || (_Var2 = Curl_is_in_callback(data), _Var2)) {
        in_RCX = &n;
        CVar3 = Curl_senddata(data,out,outlen,&n);
      }
      else {
        in_RCX = (size_t *)0x0;
        CVar3 = Curl_xfer_send(data,out,outlen,false,&n);
        if (((CVar3 == CURLE_OK) && (n == 0)) && (outlen != 0)) goto LAB_00160d44;
      }
      if (CVar3 != CURLE_OK) {
        if (CVar3 != CURLE_AGAIN) {
          Curl_failf(data,"WS: flush, write error %d",(ulong)CVar3);
          return CVar3;
        }
        if (data == (Curl_easy *)0x0) {
          return CURLE_AGAIN;
        }
LAB_00160d44:
        if (((data->set).field_0x8cd & 0x10) == 0) {
          return CURLE_AGAIN;
        }
        pcVar1 = (data->state).feat;
        if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
          return CURLE_AGAIN;
        }
        if (0 < Curl_trc_feat_ws.log_level) {
          sVar4 = Curl_bufq_len(q);
          Curl_trc_ws(data,"flush EAGAIN, %zu bytes remain in buffer",sVar4);
          return CURLE_AGAIN;
        }
        return CURLE_AGAIN;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"WS: flushed %zu bytes",n);
      }
      Curl_bufq_skip(q,n);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ws_flush(struct Curl_easy *data, struct websocket *ws,
                         bool blocking)
{
  if(!Curl_bufq_is_empty(&ws->sendbuf)) {
    CURLcode result;
    const unsigned char *out;
    size_t outlen, n;

    while(Curl_bufq_peek(&ws->sendbuf, &out, &outlen)) {
      if(blocking) {
        result = ws_send_raw_blocking(data, ws, (char *)out, outlen);
        n = result ? 0 : outlen;
      }
      else if(data->set.connect_only || Curl_is_in_callback(data))
        result = Curl_senddata(data, out, outlen, &n);
      else {
        result = Curl_xfer_send(data, out, outlen, FALSE, &n);
        if(!result && !n && outlen)
          result = CURLE_AGAIN;
      }

      if(result == CURLE_AGAIN) {
        CURL_TRC_WS(data, "flush EAGAIN, %zu bytes remain in buffer",
                    Curl_bufq_len(&ws->sendbuf));
        return result;
      }
      else if(result) {
        failf(data, "WS: flush, write error %d", result);
        return result;
      }
      else {
        infof(data, "WS: flushed %zu bytes", n);
        Curl_bufq_skip(&ws->sendbuf, n);
      }
    }
  }
  return CURLE_OK;
}